

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

void Configlist_closure(lemon *lemp)

{
  int iVar1;
  rule *prVar2;
  symbol *psVar3;
  config *cfp_00;
  int local_4c;
  int k;
  int dot;
  int i;
  symbol *xsp;
  symbol *sp;
  rule *newrp;
  rule *rp;
  config *newcfp;
  config *cfp;
  lemon *lemp_local;
  
  if (currentend == (config **)0x0) {
    __assert_fail("currentend!=0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/tools/lemon/lemon.c"
                  ,0x4f5,"void Configlist_closure(struct lemon *)");
  }
  newcfp = current;
  do {
    if (newcfp == (config *)0x0) {
      return;
    }
    prVar2 = newcfp->rp;
    iVar1 = newcfp->dot;
    if ((iVar1 < prVar2->nrhs) && (psVar3 = prVar2->rhs[iVar1], psVar3->type == NONTERMINAL)) {
      if ((psVar3->rule == (rule *)0x0) && (psVar3 != lemp->errsym)) {
        ErrorMsg(lemp->filename,prVar2->line,"Nonterminal \"%s\" has no rules.",psVar3->name);
        lemp->errorcnt = lemp->errorcnt + 1;
      }
      for (sp = (symbol *)psVar3->rule; sp != (symbol *)0x0; sp = (symbol *)sp[1].rule) {
        cfp_00 = Configlist_add((rule *)sp,0);
        k = iVar1;
        while( true ) {
          k = k + 1;
          if (prVar2->nrhs <= k) goto LAB_00104a74;
          psVar3 = prVar2->rhs[k];
          if (psVar3->type == TERMINAL) {
            SetAdd(cfp_00->fws,psVar3->index);
            goto LAB_00104a74;
          }
          if (psVar3->type == MULTITERMINAL) break;
          SetUnion(cfp_00->fws,psVar3->firstset);
          if (psVar3->lambda == LEMON_FALSE) goto LAB_00104a74;
        }
        for (local_4c = 0; local_4c < psVar3->nsubsym; local_4c = local_4c + 1) {
          SetAdd(cfp_00->fws,psVar3->subsym[local_4c]->index);
        }
LAB_00104a74:
        if (k == prVar2->nrhs) {
          Plink_add(&newcfp->fplp,cfp_00);
        }
      }
    }
    newcfp = newcfp->next;
  } while( true );
}

Assistant:

void Configlist_closure(struct lemon *lemp)
{
  struct config *cfp, *newcfp;
  struct rule *rp, *newrp;
  struct symbol *sp, *xsp;
  int i, dot;

  assert( currentend!=0 );
  for(cfp=current; cfp; cfp=cfp->next){
    rp = cfp->rp;
    dot = cfp->dot;
    if( dot>=rp->nrhs ) continue;
    sp = rp->rhs[dot];
    if( sp->type==NONTERMINAL ){
      if( sp->rule==0 && sp!=lemp->errsym ){
        ErrorMsg(lemp->filename,rp->line,"Nonterminal \"%s\" has no rules.",
          sp->name);
        lemp->errorcnt++;
      }
      for(newrp=sp->rule; newrp; newrp=newrp->nextlhs){
        newcfp = Configlist_add(newrp,0);
        for(i=dot+1; i<rp->nrhs; i++){
          xsp = rp->rhs[i];
          if( xsp->type==TERMINAL ){
            SetAdd(newcfp->fws,xsp->index);
            break;
          }else if( xsp->type==MULTITERMINAL ){
            int k;
            for(k=0; k<xsp->nsubsym; k++){
              SetAdd(newcfp->fws, xsp->subsym[k]->index);
            }
            break;
	  }else{
            SetUnion(newcfp->fws,xsp->firstset);
            if( xsp->lambda==LEMON_FALSE ) break;
	  }
	}
        if( i==rp->nrhs ) Plink_add(&cfp->fplp,newcfp);
      }
    }
  }
  return;
}